

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_gcc.cc
# Opt level: O1

void ScaleRowDown2Linear_SSSE3(uint8_t *src_ptr,ptrdiff_t src_stride,uint8_t *dst_ptr,int dst_width)

{
  undefined1 (*pauVar1) [16];
  bool bVar2;
  int iVar3;
  short sVar4;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  undefined1 auVar5 [16];
  short sVar12;
  short sVar13;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar14 [16];
  short sVar21;
  
  do {
    auVar14 = *(undefined1 (*) [16])src_ptr;
    pauVar1 = (undefined1 (*) [16])((long)src_ptr + 0x10);
    src_ptr = (uint8_t *)((long)src_ptr + 0x20);
    auVar5[8] = 1;
    auVar5._0_8_ = 0x101010101010101;
    auVar5[9] = 1;
    auVar5[10] = 1;
    auVar5[0xb] = 1;
    auVar5[0xc] = 1;
    auVar5[0xd] = 1;
    auVar5[0xe] = 1;
    auVar5[0xf] = 1;
    auVar5 = pmaddubsw(auVar14,auVar5);
    auVar14[8] = 1;
    auVar14._0_8_ = 0x101010101010101;
    auVar14[9] = 1;
    auVar14[10] = 1;
    auVar14[0xb] = 1;
    auVar14[0xc] = 1;
    auVar14[0xd] = 1;
    auVar14[0xe] = 1;
    auVar14[0xf] = 1;
    auVar14 = pmaddubsw(*pauVar1,auVar14);
    sVar4 = pavgw(auVar5._0_2_,0);
    sVar6 = pavgw(auVar5._2_2_,0);
    sVar7 = pavgw(auVar5._4_2_,0);
    sVar8 = pavgw(auVar5._6_2_,0);
    sVar9 = pavgw(auVar5._8_2_,0);
    sVar10 = pavgw(auVar5._10_2_,0);
    sVar11 = pavgw(auVar5._12_2_,0);
    sVar12 = pavgw(auVar5._14_2_,0);
    sVar13 = pavgw(auVar14._0_2_,0);
    sVar15 = pavgw(auVar14._2_2_,0);
    sVar16 = pavgw(auVar14._4_2_,0);
    sVar17 = pavgw(auVar14._6_2_,0);
    sVar18 = pavgw(auVar14._8_2_,0);
    sVar19 = pavgw(auVar14._10_2_,0);
    sVar20 = pavgw(auVar14._12_2_,0);
    sVar21 = pavgw(auVar14._14_2_,0);
    *dst_ptr = (0 < sVar4) * (sVar4 < 0x100) * (char)sVar4 - (0xff < sVar4);
    dst_ptr[1] = (0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 - (0xff < sVar6);
    dst_ptr[2] = (0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 - (0xff < sVar7);
    dst_ptr[3] = (0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8);
    dst_ptr[4] = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
    dst_ptr[5] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
    dst_ptr[6] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
    dst_ptr[7] = (0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12);
    dst_ptr[8] = (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13);
    dst_ptr[9] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
    dst_ptr[10] = (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
    dst_ptr[0xb] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
    dst_ptr[0xc] = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
    dst_ptr[0xd] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
    dst_ptr[0xe] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
    dst_ptr[0xf] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
    dst_ptr = dst_ptr + 0x10;
    iVar3 = dst_width + -0x10;
    bVar2 = 0xf < dst_width;
    dst_width = iVar3;
  } while (iVar3 != 0 && bVar2);
  return;
}

Assistant:

void ScaleRowDown2Linear_SSSE3(const uint8_t* src_ptr,
                               ptrdiff_t src_stride,
                               uint8_t* dst_ptr,
                               int dst_width) {
  (void)src_stride;
  asm volatile(
      "pcmpeqb     %%xmm4,%%xmm4                 \n"
      "psrlw       $0xf,%%xmm4                   \n"
      "packuswb    %%xmm4,%%xmm4                 \n"
      "pxor        %%xmm5,%%xmm5                 \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqu      0x10(%0),%%xmm1               \n"
      "lea         0x20(%0),%0                   \n"
      "pmaddubsw   %%xmm4,%%xmm0                 \n"
      "pmaddubsw   %%xmm4,%%xmm1                 \n"
      "pavgw       %%xmm5,%%xmm0                 \n"
      "pavgw       %%xmm5,%%xmm1                 \n"
      "packuswb    %%xmm1,%%xmm0                 \n"
      "movdqu      %%xmm0,(%1)                   \n"
      "lea         0x10(%1),%1                   \n"
      "sub         $0x10,%2                      \n"
      "jg          1b                            \n"
      : "+r"(src_ptr),   // %0
        "+r"(dst_ptr),   // %1
        "+r"(dst_width)  // %2
        ::"memory",
        "cc", "xmm0", "xmm1", "xmm4", "xmm5");
}